

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall
chrono::curiosity::CuriosityDCMotorControl::Update(CuriosityDCMotorControl *this,double time)

{
  double dVar1;
  __shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var2;
  element_type *peVar3;
  reference pvVar4;
  double dVar5;
  int local_2c;
  double dStack_28;
  int i;
  double target_torque;
  double speed_reading;
  double time_local;
  CuriosityDCMotorControl *this_local;
  
  for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
    p_Var2 = (__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                       (&((this->super_CuriosityDriver).curiosity)->m_drive_shafts,(long)local_2c);
    peVar3 = std::__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    dVar5 = ChShaft::GetPos_dt(peVar3);
    dVar5 = -dVar5;
    pvVar4 = std::array<double,_6UL>::operator[](&this->m_no_load_speed,(long)local_2c);
    if (dVar5 <= *pvVar4) {
      if (0.0 <= dVar5) {
        pvVar4 = std::array<double,_6UL>::operator[](&this->m_stall_torque,(long)local_2c);
        dStack_28 = *pvVar4;
        pvVar4 = std::array<double,_6UL>::operator[](&this->m_no_load_speed,(long)local_2c);
        dVar1 = *pvVar4;
        pvVar4 = std::array<double,_6UL>::operator[](&this->m_no_load_speed,(long)local_2c);
        dStack_28 = dStack_28 * ((dVar1 - dVar5) / *pvVar4);
      }
      else {
        pvVar4 = std::array<double,_6UL>::operator[](&this->m_stall_torque,(long)local_2c);
        dStack_28 = *pvVar4;
      }
    }
    else {
      dStack_28 = 0.0;
    }
    p_Var2 = (__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                       (&((this->super_CuriosityDriver).curiosity)->m_drive_shafts,(long)local_2c);
    peVar3 = std::__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var2);
    ChShaft::SetAppliedTorque(peVar3,-dStack_28);
  }
  return;
}

Assistant:

void CuriosityDCMotorControl::Update(double time) {
    double speed_reading;
    double target_torque;
    for (int i = 0; i < 6; i++) {
        speed_reading = -curiosity->m_drive_shafts[i]->GetPos_dt();

        if (speed_reading > m_no_load_speed[i]) {
            target_torque = 0;
        } else if (speed_reading < 0) {
            target_torque = m_stall_torque[i];
        } else {
            target_torque = m_stall_torque[i] * ((m_no_load_speed[i] - speed_reading) / m_no_load_speed[i]);
        }
        curiosity->m_drive_shafts[i]->SetAppliedTorque(-target_torque);
    }
}